

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactive.cpp
# Opt level: O3

int MainLoop(Sudoku *s)

{
  int iVar1;
  
  iVar1 = printS(s,4,4);
  return iVar1;
}

Assistant:

int MainLoop ( Sudoku * s )
{
  int x = 4,y = 4; // nastavime kurzor doprostred pole
  printS(s,x,y);
  cout << "Pro ziskani napovedy pouzijte prikaz 'help'." << endl;
  printPrompt();
  while (true)
  {
    string prikaz;
    cin >> prikaz;
    cin.clear();
    cin.ignore(1000, '\n');
    if ( prikaz == "help")
    {
      printHelp();
      printPrompt();
    }
    else if (prikaz == "print")
    {
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "solve")
    {
      if (!s->rekurzivniReseni())
        cout << "Neco je velmi spatne..." << endl;
      printVitezstvi(s);
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "rsolve")
    {
      s->restart();
      if (!s->rekurzivniReseni())
        cout << "Neco je velmi spatne..." << endl;
      printVitezstvi(s);
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "w")
    {
      y--;
      if (y < 0) y+=9;
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "s")
    {
      y++;
      if (y > 8) y-=9;
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "a")
    {
      x--;
      if (x < 0) x+=9;
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "d")
    {
      x++;
      if (x > 8) x-=9;
      printS(s,x,y);
      printPrompt();
    }
    // mazani cisla
    else if (prikaz == "." || prikaz == "x" || prikaz == "0")
    {
      s->smazat(x,y);
      printS(s,x,y);
      printPrompt();
    }
    // doplnovani cisla
    else if(prikaz == "1" || prikaz == "2" || prikaz == "3" || prikaz == "4" || prikaz == "5" || prikaz == "6" || prikaz == "7" || prikaz == "8" || prikaz == "9")
    {
      int i = atoi(prikaz.c_str());
      s->doplnM(x,y,i);
      printS(s,x,y);
      printVitezstvi(s);
      printPrompt();
    }
    else if(prikaz == "exit")
    {
      cout << endl;
      return 0;
    }
    else if(prikaz == "reset")
    {
      s->restart();
      printS(s,x,y);
      printPrompt();
    }
    else
    {
      printHelp();
      printPrompt();
    }
  }
  return 0;
}